

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.cpp
# Opt level: O0

void __thiscall Al::internal::ProgressEngine::~ProgressEngine(ProgressEngine *this)

{
  long in_RDI;
  undefined8 local_10;
  
  std::
  unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
  ::~unordered_map((unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
                    *)0x13648f);
  local_10 = in_RDI + 0x8080;
  do {
    local_10 = local_10 + -0x200;
    InputQueue::~InputQueue((InputQueue *)0x1364bf);
  } while (local_10 != in_RDI + 0x80);
  std::condition_variable::~condition_variable((condition_variable *)(in_RDI + 0x38));
  std::thread::~thread((thread *)0x1364ea);
  return;
}

Assistant:

ProgressEngine::~ProgressEngine() {}